

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::BufferSupport::BufferSupport
          (BufferSupport *this,ResourceDescription *resourceDesc,BufferType bufferType,
          AccessMode mode,VkShaderStageFlagBits stage,DispatchCall dispatchCall)

{
  char *pcVar1;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (this->super_OperationSupport)._vptr_OperationSupport = (_func_int **)&PTR__BufferSupport_00bdd250
  ;
  ResourceDescription::ResourceDescription(&this->m_resourceDesc,resourceDesc);
  this->m_bufferType = bufferType;
  this->m_mode = mode;
  this->m_stage = stage;
  pcVar1 = "write_";
  if (mode == ACCESS_MODE_READ) {
    pcVar1 = "read_";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar1,&local_49);
  pcVar1 = "ssbo_";
  if (this->m_bufferType == BUFFER_TYPE_UNIFORM) {
    pcVar1 = "ubo_";
  }
  std::operator+(&this->m_shaderPrefix,&local_48,pcVar1);
  std::__cxx11::string::~string((string *)&local_48);
  this->m_dispatchCall = dispatchCall;
  return;
}

Assistant:

BufferSupport (const ResourceDescription&	resourceDesc,
				   const BufferType				bufferType,
				   const AccessMode				mode,
				   const VkShaderStageFlagBits	stage,
				   const DispatchCall			dispatchCall = DISPATCH_CALL_DISPATCH)
		: m_resourceDesc	(resourceDesc)
		, m_bufferType		(bufferType)
		, m_mode			(mode)
		, m_stage			(stage)
		, m_shaderPrefix	(std::string(m_mode == ACCESS_MODE_READ ? "read_" : "write_") + (m_bufferType == BUFFER_TYPE_UNIFORM ? "ubo_" : "ssbo_"))
		, m_dispatchCall	(dispatchCall)
	{
		DE_ASSERT(m_resourceDesc.type == RESOURCE_TYPE_BUFFER);
		DE_ASSERT(m_bufferType == BUFFER_TYPE_UNIFORM || m_bufferType == BUFFER_TYPE_STORAGE);
		DE_ASSERT(m_mode == ACCESS_MODE_READ || m_mode == ACCESS_MODE_WRITE);
		DE_ASSERT(m_mode == ACCESS_MODE_READ || m_bufferType == BUFFER_TYPE_STORAGE);
		DE_ASSERT(m_bufferType != BUFFER_TYPE_UNIFORM || m_resourceDesc.size.x() <= MAX_UBO_RANGE);
		DE_ASSERT(m_dispatchCall == DISPATCH_CALL_DISPATCH || m_dispatchCall == DISPATCH_CALL_DISPATCH_INDIRECT);

		assertValidShaderStage(m_stage);
	}